

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImBezierClosestPoint(ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,ImVec2 *p,int num_segments)

{
  int iVar1;
  undefined1 auVar2 [16];
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar6 [64];
  float fVar7;
  ImVec2 IVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar5 [64];
  undefined1 extraout_var [56];
  
  if (num_segments < 1) {
    IVar8.x = 0.0;
    IVar8.y = 0.0;
  }
  else {
    auVar10 = ZEXT816(0) << 0x40;
    iVar3 = 1;
    auVar11 = ZEXT464(0x7f7fffff);
    auVar5 = ZEXT864((ulong)*p1);
    do {
      auVar4 = auVar5._0_16_;
      auVar6._0_8_ = ImBezierCalc(p1,p2,p3,p4,(float)iVar3 * (1.0 / (float)num_segments));
      auVar6._8_56_ = extraout_var;
      auVar9 = vmovshdup_avx(auVar4);
      auVar2 = vsubps_avx(auVar6._0_16_,auVar4);
      auVar12 = vmovshdup_avx(auVar2);
      fVar7 = auVar12._0_4_;
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (p->y - auVar9._0_4_))),auVar2,
                               ZEXT416((uint)(p->x - auVar5._0_4_)));
      fVar13 = auVar9._0_4_;
      if (0.0 <= fVar13) {
        auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),auVar2,auVar2);
        fVar7 = auVar9._0_4_;
        auVar4 = auVar6._0_16_;
        if (fVar13 <= fVar7) {
          auVar9._0_4_ = auVar2._0_4_ * fVar13;
          auVar9._4_4_ = auVar2._4_4_ * fVar13;
          auVar9._8_4_ = auVar2._8_4_ * fVar13;
          auVar9._12_4_ = auVar2._12_4_ * fVar13;
          auVar12._4_4_ = fVar7;
          auVar12._0_4_ = fVar7;
          auVar12._8_4_ = fVar7;
          auVar12._12_4_ = fVar7;
          auVar9 = vdivps_avx(auVar9,auVar12);
          auVar4._0_4_ = auVar5._0_4_ + auVar9._0_4_;
          auVar4._4_4_ = auVar5._4_4_ + auVar9._4_4_;
          auVar4._8_4_ = auVar5._8_4_ + auVar9._8_4_;
          auVar4._12_4_ = auVar5._12_4_ + auVar9._12_4_;
        }
      }
      auVar9 = vmovshdup_avx(auVar4);
      fVar7 = p->y - auVar9._0_4_;
      auVar9 = ZEXT416((uint)(p->x - auVar4._0_4_));
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),auVar9,auVar9);
      if (auVar11._0_4_ <= auVar9._0_4_) {
        auVar4 = auVar10;
      }
      auVar10 = auVar4;
      IVar8 = auVar10._0_8_;
      auVar9 = vminss_avx(auVar9,ZEXT416((uint)auVar11._0_4_));
      auVar11 = ZEXT1664(auVar9);
      iVar1 = (1 - num_segments) + iVar3;
      iVar3 = iVar3 + 1;
      auVar5 = auVar6;
    } while (iVar1 != 1);
  }
  return IVar8;
}

Assistant:

ImVec2 ImBezierClosestPoint(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, const ImVec2& p, int num_segments)
{
    IM_ASSERT(num_segments > 0); // Use ImBezierClosestPointCasteljau()
    ImVec2 p_last = p1;
    ImVec2 p_closest;
    float p_closest_dist2 = FLT_MAX;
    float t_step = 1.0f / (float)num_segments;
    for (int i_step = 1; i_step <= num_segments; i_step++)
    {
        ImVec2 p_current = ImBezierCalc(p1, p2, p3, p4, t_step * i_step);
        ImVec2 p_line = ImLineClosestPoint(p_last, p_current, p);
        float dist2 = ImLengthSqr(p - p_line);
        if (dist2 < p_closest_dist2)
        {
            p_closest = p_line;
            p_closest_dist2 = dist2;
        }
        p_last = p_current;
    }
    return p_closest;
}